

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestLookupByNameReturnsNoValueForUnknownFieldNames_Test::TestBody
          (ExtendedDataDictionaryTest_TestLookupByNameReturnsNoValueForUnknownFieldNames_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  AssertHelper local_c0;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string local_a8;
  byte local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  long *local_30 [2];
  long local_20 [2];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"");
  bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
            (&local_a8,extendable_data_dictionary,local_30);
  local_b8[0] = (internal)(local_78 ^ 1);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78 == 1) {
    local_78 = 0;
    if ((undefined1 *)local_a8._M_string_length != (undefined1 *)((long)&local_a8.field_2 + 8)) {
      operator_delete((void *)local_a8._M_string_length,local_a8.field_2._8_8_ + 1);
    }
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,local_b8,
               (AssertionResult *)"extendable_data_dictionary.FieldDefByName(\"\")","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0x55,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Unknown","");
  bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
            (&local_a8,extendable_data_dictionary,local_50);
  local_b8[0] = (internal)(local_78 ^ 1);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78 == 1) {
    local_78 = 0;
    if ((undefined1 *)local_a8._M_string_length != (undefined1 *)((long)&local_a8.field_2 + 8)) {
      operator_delete((void *)local_a8._M_string_length,local_a8.field_2._8_8_ + 1);
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,local_b8,
               (AssertionResult *)"extendable_data_dictionary.FieldDefByName(\"Unknown\")","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0x56,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"SillyFieldName","");
  bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
            (&local_a8,extendable_data_dictionary,local_70);
  local_b8[0] = (internal)(local_78 ^ 1);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78 == 1) {
    local_78 = 0;
    if ((undefined1 *)local_a8._M_string_length != (undefined1 *)((long)&local_a8.field_2 + 8)) {
      operator_delete((void *)local_a8._M_string_length,local_a8.field_2._8_8_ + 1);
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,local_b8,
               (AssertionResult *)"extendable_data_dictionary.FieldDefByName(\"SillyFieldName\")",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0x57,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestTheAbilityOfTheCollectionToGrowItsCapacity)
{
    ExtendableDataDictionary data_dictionary = ExtendableDataDictionary();
    ASSERT_EQ(0, data_dictionary.size());
    ASSERT_EQ(0, data_dictionary.NextFreeFid());
    for (int i = 0; i < 1000; i++)
    {
        FieldDef field_def(i, FieldTypeEnum::STRING,
                         "Bidder" + std::to_string(i),
                         FieldEncodingEnum::FIXED1, 1);
        data_dictionary.AddFieldDef(field_def);
        ASSERT_EQ(i + 1, data_dictionary.size());
        ASSERT_EQ(i + 1, data_dictionary.NextFreeFid());
    }
}